

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationEnd
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  size_type sVar1;
  reference ppTVar2;
  int local_20;
  int i;
  int iteration_local;
  UnitTest *unit_test_local;
  TestEventRepeater *this_local;
  
  if ((this->forwarding_enabled_ & 1U) != 0) {
    sVar1 = std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ::size(&this->listeners_);
    local_20 = (int)sVar1;
    while (local_20 = local_20 + -1, -1 < local_20) {
      ppTVar2 = std::
                vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ::operator[](&this->listeners_,(long)local_20);
      (*(*ppTVar2)->_vptr_TestEventListener[0xd])(*ppTVar2,unit_test,(ulong)(uint)iteration);
    }
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationEnd(const UnitTest& unit_test,
                                           int iteration) {
  if (forwarding_enabled_) {
    for (int i = static_cast<int>(listeners_.size()) - 1; i >= 0; i--) {
      listeners_[i]->OnTestIterationEnd(unit_test, iteration);
    }
  }
}